

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemv.hpp
# Opt level: O0

void remora::bindings::
     gemv_impl<remora::dense_vector_adaptor<double,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_vector_adaptor<double_const,remora::continuous_dense_tag,remora::cpu_tag>>
               (double param_1,
               matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
               *param_2,undefined8 param_3,
               vector_expression<remora::dense_vector_adaptor<double,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
               *param_4)

{
  double dVar1;
  dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag> *this;
  matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *pmVar2;
  dense_vector_adaptor<double,_remora::continuous_dense_tag,_remora::cpu_tag> *this_00;
  reference pdVar3;
  size_t i;
  value_type value;
  double in_stack_ffffffffffffff98;
  matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *m;
  undefined1 local_50 [24];
  matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *local_38;
  double local_30;
  double local_28;
  vector_expression<remora::dense_vector_adaptor<double,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *local_20;
  undefined8 local_18;
  matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *local_10;
  
  local_38 = (matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
              *)0x0;
  local_28 = param_1;
  local_20 = param_4;
  local_18 = param_3;
  local_10 = param_2;
  while( true ) {
    m = local_38;
    this = matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(local_10);
    pmVar2 = (matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
              *)dense_matrix_adaptor<const_double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>
                ::size1(this);
    if (m == pmVar2) break;
    row<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::cpu_tag>
              (m,(size_type)in_stack_ffffffffffffff98);
    dot<remora::dense_vector_adaptor<double_const,remora::dense_tag,remora::cpu_tag>,remora::dense_vector_adaptor<double_const,remora::continuous_dense_tag,remora::cpu_tag>,double>
              (local_50,local_18,&local_30);
    dVar1 = local_28;
    if ((local_30 != 0.0) || (NAN(local_30))) {
      in_stack_ffffffffffffff98 = local_30;
      this_00 = vector_expression<remora::dense_vector_adaptor<double,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                ::operator()(local_20);
      pdVar3 = dense_vector_adaptor<double,_remora::continuous_dense_tag,_remora::cpu_tag>::
               operator()(this_00,(size_type)local_38);
      *pdVar3 = dVar1 * in_stack_ffffffffffffff98 + *pdVar3;
    }
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void gemv_impl(
	matrix_expression<MatA, cpu_tag> const& A,
	vector_expression<V, cpu_tag> const& x,
	vector_expression<ResultV, cpu_tag>& result, 
	typename ResultV::value_type alpha,
	row_major
) {
	typedef typename ResultV::value_type value_type;
	value_type value;
	for(std::size_t i = 0; i != A().size1();++i){
		bindings::dot(row(A,i), x, value,  typename MatA::evaluation_category::tag(), typename V::evaluation_category::tag());
		if(value != value_type())//handling of sparse results.
			result()(i) += alpha * value;
	}
}